

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

InstanceDataHeader * rw::d3d9::instanceMesh(ObjPipeline *rwpipe,Geometry *geo)

{
  MeshHeader *this;
  InstanceDataHeader *pIVar1;
  InstanceData *pIVar2;
  void *pvVar3;
  uint16 *puVar4;
  uint32 uVar5;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint32 j;
  uint32 i;
  uint32 startindex;
  Mesh *mesh;
  InstanceData *inst;
  uint16 *indices;
  MeshHeader *meshh;
  InstanceDataHeader *header;
  Geometry *geo_local;
  ObjPipeline *rwpipe_local;
  
  pIVar1 = (InstanceDataHeader *)
           mustmalloc_LOC(0x70,0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 347"
                         );
  this = geo->meshHeader;
  (pIVar1->super_InstanceDataHeader).platform = 9;
  pIVar1->serialNumber = (uint)this->serialNum;
  pIVar1->numMeshes = (uint)this->numMeshes;
  uVar5 = 4;
  if (this->flags == 1) {
    uVar5 = 5;
  }
  pIVar1->primType = uVar5;
  pIVar1->useOffsets = 0;
  pIVar1->vertexDeclaration = (void *)0x0;
  pIVar1->totalNumVertex = geo->numVertices;
  pIVar1->totalNumIndex = this->totalIndices;
  pIVar2 = (InstanceData *)
           mustmalloc_LOC((ulong)pIVar1->numMeshes * 0x30,0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 358"
                         );
  pIVar1->inst = pIVar2;
  pvVar3 = d3d::createIndexBuffer(pIVar1->totalNumIndex << 1,false);
  pIVar1->indexBuffer = pvVar3;
  puVar4 = d3d::lockIndices(pIVar1->indexBuffer,0,0,0);
  mesh = (Mesh *)pIVar1->inst;
  _i = MeshHeader::getMeshes(this);
  j = 0;
  for (local_48 = 0; local_48 < pIVar1->numMeshes; local_48 = local_48 + 1) {
    findMinVertAndNumVertices
              (_i->indices,_i->numIndices,(uint32 *)((long)&mesh->indices + 4),
               (int32 *)&mesh[1].field_0xc);
    *(uint32 *)&mesh->indices = _i->numIndices;
    *(Material **)&mesh->numIndices = _i->material;
    *(undefined4 *)&mesh->material = 0;
    mesh[1].indices = (uint16 *)0x0;
    mesh[1].numIndices = *(uint32 *)((long)&mesh->indices + 4);
    *(uint32 *)&mesh[1].material = j;
    if (pIVar1->primType == 5) {
      local_50 = *(int *)&mesh->indices - 2;
    }
    else {
      local_50 = *(uint *)&mesh->indices / 3;
    }
    *(uint *)((long)&mesh[1].material + 4) = local_50;
    if (*(int *)((long)&mesh->indices + 4) == 0) {
      memcpy(puVar4 + *(uint *)&mesh[1].material,_i->indices,
             (ulong)(uint)(*(int *)&mesh->indices << 1));
    }
    else {
      for (local_4c = 0; local_4c < *(uint *)&mesh->indices; local_4c = local_4c + 1) {
        puVar4[*(int *)&mesh[1].material + local_4c] =
             _i->indices[local_4c] - (short)*(undefined4 *)((long)&mesh->indices + 4);
      }
    }
    j = *(int *)&mesh->indices + j;
    _i = _i + 1;
    mesh = mesh + 2;
  }
  d3d::unlockIndices(pIVar1->indexBuffer);
  memset(pIVar1->vertexStream,0,0x30);
  return pIVar1;
}

Assistant:

static InstanceDataHeader*
instanceMesh(rw::ObjPipeline *rwpipe, Geometry *geo)
{
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	header->platform = PLATFORM_D3D9;

	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->primType = meshh->flags == 1 ? D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
	header->useOffsets = 0;
	header->vertexDeclaration = nil;
	header->totalNumVertex = geo->numVertices;
	header->totalNumIndex = meshh->totalIndices;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	header->indexBuffer = createIndexBuffer(header->totalNumIndex*2, false);

	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	InstanceData *inst = header->inst;
	Mesh *mesh = meshh->getMeshes();
	uint32 startindex = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, (int32*)&inst->numVertices);
		inst->numIndex = mesh->numIndices;
		inst->material = mesh->material;
		inst->vertexAlpha = 0;
		inst->vertexShader = nil;
		inst->baseIndex = inst->minVert;
		inst->startIndex = startindex;
		inst->numPrimitives = header->primType == D3DPT_TRIANGLESTRIP ? inst->numIndex-2 : inst->numIndex/3;
		if(inst->minVert == 0)
			memcpy(&indices[inst->startIndex], mesh->indices, inst->numIndex*2);
		else
			for(uint32 j = 0; j < inst->numIndex; j++)
				indices[inst->startIndex+j] = mesh->indices[j] - inst->minVert;
		startindex += inst->numIndex;
		mesh++;
		inst++;
	}
	unlockIndices(header->indexBuffer);

	memset(&header->vertexStream, 0, 2*sizeof(VertexStream));

	return header;
}